

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::offset_line_starts(Fl_Text_Display *this,int newTopLineNum)

{
  int iVar1;
  int oldFirstChar;
  uint uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint endLine;
  uint uVar8;
  uint uVar9;
  long lVar10;
  
  iVar1 = this->mTopLineNum;
  uVar8 = newTopLineNum - iVar1;
  if (uVar8 == 0) {
    return;
  }
  oldFirstChar = this->mFirstChar;
  uVar2 = this->mNVisibleLines;
  lVar10 = (long)(int)uVar2;
  piVar3 = this->mLineStarts;
  endLine = -uVar8;
  if (newTopLineNum < (int)endLine && newTopLineNum < iVar1) {
    iVar4 = newTopLineNum + -1;
    iVar5 = 0;
LAB_001d06f0:
    iVar4 = skip_lines(this,iVar5,iVar4,true);
  }
  else {
    uVar9 = endLine;
    iVar4 = oldFirstChar;
    if (iVar1 <= newTopLineNum) {
      iVar5 = uVar2 + iVar1 + -1;
      iVar4 = newTopLineNum - iVar5;
      if (newTopLineNum < iVar5) {
        iVar4 = piVar3[(int)uVar8];
        goto LAB_001d0722;
      }
      iVar5 = this->mNBufferLines - newTopLineNum;
      if (iVar4 < iVar5) {
        iVar5 = piVar3[lVar10 + -1];
        goto LAB_001d06f0;
      }
      uVar9 = iVar5 + 1;
      iVar4 = this->mBuffer->mLength;
    }
    iVar4 = rewind_lines(this,iVar4,uVar9);
  }
LAB_001d0722:
  this->mFirstChar = iVar4;
  if ((int)uVar8 < 0) {
    if ((int)endLine < (int)uVar2) {
      for (; (long)(ulong)endLine < lVar10; lVar10 = lVar10 + -1) {
        piVar3[lVar10 + -1] = piVar3[((long)newTopLineNum + lVar10 + -1) - (long)iVar1];
      }
      uVar9 = 0;
      goto LAB_001d07b0;
    }
  }
  else if ((int)uVar8 < (int)uVar2) {
    endLine = uVar2 - 1;
    uVar9 = uVar2 - uVar8;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar9) {
      uVar7 = (ulong)uVar9;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      piVar3[uVar6] = piVar3[uVar8 + uVar6];
    }
    goto LAB_001d07b0;
  }
  uVar9 = 0;
  endLine = uVar2;
LAB_001d07b0:
  calc_line_starts(this,uVar9,endLine);
  calc_last_char(this);
  this->mTopLineNum = newTopLineNum;
  absolute_top_line_number(this,oldFirstChar);
  return;
}

Assistant:

void Fl_Text_Display::offset_line_starts( int newTopLineNum ) {
  int oldTopLineNum = mTopLineNum;
  int oldFirstChar = mFirstChar;
  int lineDelta = newTopLineNum - oldTopLineNum;
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int i, lastLineNum;
  Fl_Text_Buffer *buf = mBuffer;

  /* If there was no offset, nothing needs to be changed */
  if ( lineDelta == 0 )
    return;

  /* Find the new value for mFirstChar by counting lines from the nearest
   known line start (start or end of buffer, or the closest value in the
   lineStarts array) */
  lastLineNum = oldTopLineNum + nVisLines - 1;
  if ( newTopLineNum < oldTopLineNum && newTopLineNum < -lineDelta ) {
    mFirstChar = skip_lines( 0, newTopLineNum - 1, true );
  } else if ( newTopLineNum < oldTopLineNum ) {
    mFirstChar = rewind_lines( mFirstChar, -lineDelta );
  } else if ( newTopLineNum < lastLineNum ) {
    mFirstChar = lineStarts[ newTopLineNum - oldTopLineNum ];
  } else if ( newTopLineNum - lastLineNum < mNBufferLines - newTopLineNum ) {
    mFirstChar = skip_lines( lineStarts[ nVisLines - 1 ],
                            newTopLineNum - lastLineNum, true );
  } else {
    mFirstChar = rewind_lines( buf->length(), mNBufferLines - newTopLineNum + 1 );
  }

  /* Fill in the line starts array */
  if ( lineDelta < 0 && -lineDelta < nVisLines ) {
    for ( i = nVisLines - 1; i >= -lineDelta; i-- )
      lineStarts[ i ] = lineStarts[ i + lineDelta ];
    calc_line_starts( 0, -lineDelta );
  } else if ( lineDelta > 0 && lineDelta < nVisLines ) {
    for ( i = 0; i < nVisLines - lineDelta; i++ )
      lineStarts[ i ] = lineStarts[ i + lineDelta ];
    calc_line_starts( nVisLines - lineDelta, nVisLines - 1 );
  } else
    calc_line_starts( 0, nVisLines );

  /* Set lastChar and mTopLineNum */
  calc_last_char();
  mTopLineNum = newTopLineNum;

  /* If we're numbering lines or being asked to maintain an absolute line
   number, re-calculate the absolute line number */
  absolute_top_line_number(oldFirstChar);
}